

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O0

st_h2o_http1client_private_t *
create_client(h2o_http1client_t **_client,void *data,h2o_http1client_ctx_t *ctx,
             h2o_iovec_t ssl_server_name,h2o_http1client_connect_cb cb)

{
  st_h2o_http1client_private_t *__dest;
  h2o_iovec_t hVar1;
  char *local_e0;
  h2o_http1client_connect_cb local_d0 [18];
  st_h2o_http1client_private_t *local_40;
  st_h2o_http1client_private_t *client;
  h2o_http1client_connect_cb cb_local;
  h2o_http1client_ctx_t *ctx_local;
  void *data_local;
  h2o_http1client_t **_client_local;
  h2o_iovec_t ssl_server_name_local;
  
  ssl_server_name_local.base = (char *)ssl_server_name.len;
  _client_local = (h2o_http1client_t **)ssl_server_name.base;
  client = (st_h2o_http1client_private_t *)cb;
  cb_local = (h2o_http1client_connect_cb)ctx;
  ctx_local = (h2o_http1client_ctx_t *)data;
  data_local = _client;
  __dest = (st_h2o_http1client_private_t *)h2o_mem_alloc(0x90);
  local_40 = __dest;
  memset(local_d0,0,0x90);
  local_d0[0] = cb_local;
  memcpy(__dest,local_d0,0x90);
  if (_client_local != (h2o_http1client_t **)0x0) {
    hVar1 = h2o_strdup((h2o_mem_pool_t *)0x0,(char *)_client_local,
                       (size_t)ssl_server_name_local.base);
    local_e0 = hVar1.base;
    (local_40->super).ssl.server_name = local_e0;
  }
  (local_40->super).data = ctx_local;
  (local_40->_cb).on_connect = (h2o_http1client_connect_cb)client;
  if (data_local != (void *)0x0) {
    *(st_h2o_http1client_private_t **)data_local = local_40;
  }
  return local_40;
}

Assistant:

static struct st_h2o_http1client_private_t *create_client(h2o_http1client_t **_client, void *data, h2o_http1client_ctx_t *ctx,
                                                          h2o_iovec_t ssl_server_name, h2o_http1client_connect_cb cb)
{
    struct st_h2o_http1client_private_t *client = h2o_mem_alloc(sizeof(*client));

    *client = (struct st_h2o_http1client_private_t){{ctx}};
    if (ssl_server_name.base != NULL)
        client->super.ssl.server_name = h2o_strdup(NULL, ssl_server_name.base, ssl_server_name.len).base;
    client->super.data = data;
    client->_cb.on_connect = cb;
    /* caller needs to setup _cb, timeout.cb, sock, and sock->data */

    if (_client != NULL)
        *_client = &client->super;
    return client;
}